

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O3

void removeFd(Sockets *sockets,curl_socket_t fd,int mention)

{
  curl_socket_t *pcVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (mention != 0) {
    curl_mfprintf(_stderr,"Remove socket fd %d\n",fd);
  }
  iVar3 = sockets->count;
  if (0 < iVar3) {
    lVar5 = -1;
    lVar4 = 0;
    do {
      pcVar1 = sockets->sockets;
      if (pcVar1[lVar4] == fd) {
        iVar2 = iVar3 + -1;
        if (lVar4 < iVar3 + -1) {
          memmove(pcVar1 + lVar4,pcVar1 + lVar4 + 1,(iVar3 + lVar5) * 4);
          iVar2 = sockets->count + -1;
        }
        iVar3 = iVar2;
        sockets->count = iVar3;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar4 < iVar3);
  }
  return;
}

Assistant:

static void removeFd(struct Sockets* sockets, curl_socket_t fd, int mention)
{
  int i;

  if(mention)
    fprintf(stderr, "Remove socket fd %d\n", (int) fd);

  for(i = 0; i < sockets->count; ++i) {
    if(sockets->sockets[i] == fd) {
      if(i < sockets->count - 1)
        memmove(&sockets->sockets[i], &sockets->sockets[i + 1],
              sizeof(curl_socket_t) * (sockets->count - (i + 1)));
      --sockets->count;
    }
  }
}